

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

App * __thiscall CLI::App::get_subcommand(App *this,App *subcom)

{
  pointer puVar1;
  App *pAVar2;
  pointer pcVar3;
  App *in_RAX;
  OptionNotFound *this_00;
  pointer puVar4;
  bool bVar5;
  string local_40;
  
  puVar4 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar5 = puVar4 == puVar1;
  if (!bVar5) {
    pAVar2 = (puVar4->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
             super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
             super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
    while (in_RAX = subcom, pAVar2 != subcom) {
      puVar4 = puVar4 + 1;
      bVar5 = puVar4 == puVar1;
      if (bVar5) break;
      pAVar2 = (puVar4->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
               super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
               super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
    }
  }
  if (bVar5) {
    this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    pcVar3 = (subcom->name_)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar3,pcVar3 + (subcom->name_)._M_string_length);
    OptionNotFound::OptionNotFound(this_00,&local_40);
    __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
  }
  return in_RAX;
}

Assistant:

App *get_subcommand(App *subcom) const {
        for(const App_p &subcomptr : subcommands_)
            if(subcomptr.get() == subcom)
                return subcom;
        throw OptionNotFound(subcom->get_name());
    }